

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeLhs(SPxLPBase<double> *this,VectorBase<double> *newLhs,bool scale)

{
  int iVar1;
  double *pdVar2;
  byte in_DL;
  VectorBase<double> *in_RSI;
  LPRowSetBase<double> *in_RDI;
  double dVar3;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  LPRowSetBase<double> *this_00;
  int local_18;
  
  if ((in_DL & 1) == 0) {
    LPRowSetBase<double>::lhs_w(in_RDI);
    VectorBase<double>::operator=(in_stack_ffffffffffffffc0,in_RSI);
  }
  else {
    local_18 = 0;
    while( true ) {
      lhs((SPxLPBase<double> *)0x2607b5);
      iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x2607bd);
      if (iVar1 <= local_18) break;
      this_00 = (LPRowSetBase<double> *)
                in_RDI[2].super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                memFactor;
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)this_00,
                          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      dVar3 = (double)(*(code *)(((_Vector_impl *)
                                 &(this_00->super_SVSetBase<double>).
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)->
                                super__Vector_impl_data)._M_start[0x2d])
                                (*pdVar2,this_00,in_RDI,local_18);
      pdVar2 = LPRowSetBase<double>::lhs_w(this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *pdVar2 = dVar3;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

virtual void changeLhs(const VectorBase<R>& newLhs, bool scale = false)
   {
      assert(lhs().dim() == newLhs.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < lhs().dim(); i++)
            LPRowSetBase<R>::lhs_w(i) = lp_scaler->scaleLhs(*this, i, newLhs[i]);
      }
      else
         LPRowSetBase<R>::lhs_w() = newLhs;

      assert(isConsistent());
   }